

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_> __thiscall
anon_unknown.dwarf_145302::BuildSystemFileDelegate::lookupTool
          (BuildSystemFileDelegate *this,StringRef name)

{
  bool bVar1;
  BuildSystemDelegate *pBVar2;
  char *in_RCX;
  unique_ptr<(anonymous_namespace)::SwiftCompilerTool,_std::default_delete<(anonymous_namespace)::SwiftCompilerTool>_>
  local_5e8;
  char *local_5e0 [2];
  BuildSystemFileDelegate *local_5d0;
  char *local_5c8;
  unique_ptr<(anonymous_namespace)::StaleFileRemovalTool,_std::default_delete<(anonymous_namespace)::StaleFileRemovalTool>_>
  local_5c0;
  char *local_5b8 [2];
  BuildSystemFileDelegate *local_5a8;
  char *local_5a0;
  unique_ptr<(anonymous_namespace)::SharedLibraryTool,_std::default_delete<(anonymous_namespace)::SharedLibraryTool>_>
  local_598;
  char *local_590 [2];
  BuildSystemFileDelegate *local_580;
  char *local_578;
  unique_ptr<(anonymous_namespace)::ArchiveTool,_std::default_delete<(anonymous_namespace)::ArchiveTool>_>
  local_570;
  char *local_568 [2];
  BuildSystemFileDelegate *local_558;
  char *local_550;
  unique_ptr<(anonymous_namespace)::SymlinkTool,_std::default_delete<(anonymous_namespace)::SymlinkTool>_>
  local_548;
  char *local_540 [2];
  BuildSystemFileDelegate *local_530;
  char *local_528;
  unique_ptr<(anonymous_namespace)::MkdirTool,_std::default_delete<(anonymous_namespace)::MkdirTool>_>
  local_520;
  char *local_518 [2];
  BuildSystemFileDelegate *local_508;
  char *local_500;
  unique_ptr<(anonymous_namespace)::ClangTool,_std::default_delete<(anonymous_namespace)::ClangTool>_>
  local_4f8;
  char *local_4f0 [2];
  BuildSystemFileDelegate *local_4e0;
  char *local_4d8;
  unique_ptr<(anonymous_namespace)::PhonyTool,_std::default_delete<(anonymous_namespace)::PhonyTool>_>
  local_4d0;
  char *local_4c8 [2];
  BuildSystemFileDelegate *local_4b8;
  char *local_4b0;
  unique_ptr<(anonymous_namespace)::ShellTool,_std::default_delete<(anonymous_namespace)::ShellTool>_>
  local_4a8;
  char *local_4a0 [2];
  BuildSystemFileDelegate *local_490;
  char *local_488;
  uint local_47c;
  BuildSystemFileDelegate *local_478;
  char *local_470;
  byte local_461;
  BuildSystemFileDelegate *local_460;
  BuildSystemFileDelegate *this_local;
  StringRef name_local;
  unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_> *tool;
  BuildSystemFileDelegate *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  BuildSystemFileDelegate *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  BuildSystemFileDelegate *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  BuildSystemFileDelegate *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  BuildSystemFileDelegate *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  BuildSystemFileDelegate *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  BuildSystemFileDelegate *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  BuildSystemFileDelegate *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  BuildSystemFileDelegate *local_2a0;
  char *local_298;
  BuildSystemFileDelegate **local_290;
  char *local_288;
  char *local_280;
  BuildSystemFileDelegate **local_278;
  char *local_270;
  char *local_268;
  BuildSystemFileDelegate **local_260;
  char *local_258;
  char *local_250;
  BuildSystemFileDelegate **local_248;
  char *local_240;
  char *local_238;
  BuildSystemFileDelegate **local_230;
  char *local_228;
  char *local_220;
  BuildSystemFileDelegate **local_218;
  char *local_210;
  char *local_208;
  BuildSystemFileDelegate **local_200;
  char *local_1f8;
  char *local_1f0;
  BuildSystemFileDelegate **local_1e8;
  char *local_1e0;
  char *local_1d8;
  BuildSystemFileDelegate **local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  BuildSystemFileDelegate *local_1a8;
  int local_19c;
  char *local_198;
  char *local_190;
  BuildSystemFileDelegate *local_188;
  int local_17c;
  char *local_178;
  char *local_170;
  BuildSystemFileDelegate *local_168;
  int local_15c;
  char *local_158;
  char *local_150;
  BuildSystemFileDelegate *local_148;
  int local_13c;
  char *local_138;
  char *local_130;
  BuildSystemFileDelegate *local_128;
  int local_11c;
  char *local_118;
  char *local_110;
  BuildSystemFileDelegate *local_108;
  int local_fc;
  char *local_f8;
  char *local_f0;
  BuildSystemFileDelegate *local_e8;
  int local_dc;
  char *local_d8;
  char *local_d0;
  BuildSystemFileDelegate *local_c8;
  int local_bc;
  char *local_b8;
  char *local_b0;
  BuildSystemFileDelegate *local_a8;
  int local_9c;
  char *local_98;
  char **local_90;
  char *local_88;
  char **local_80;
  char *local_78;
  char **local_70;
  char *local_68;
  char **local_60;
  char *local_58;
  char **local_50;
  char *local_48;
  char **local_40;
  char *local_38;
  char **local_30;
  char *local_28;
  char **local_20;
  char *local_18;
  char **local_10;
  
  this_local = (BuildSystemFileDelegate *)name.Length;
  local_460 = (BuildSystemFileDelegate *)name.Data;
  local_461 = 0;
  name_local.Data = in_RCX;
  name_local.Length = (size_t)this;
  pBVar2 = getSystemDelegate(local_460);
  local_478 = this_local;
  local_470 = name_local.Data;
  (*pBVar2->_vptr_BuildSystemDelegate[4])(this,pBVar2,this_local,name_local.Data);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)this);
  if (bVar1) {
    local_461 = 1;
  }
  local_47c = (uint)bVar1;
  if ((local_461 & 1) == 0) {
    std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>::
    ~unique_ptr((unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>
                 *)this);
  }
  if (local_47c == 0) {
    local_490 = this_local;
    local_488 = name_local.Data;
    local_90 = local_4a0;
    local_98 = "shell";
    local_4a0[0] = "shell";
    local_2b8 = (char *)strlen("shell");
    local_2a0 = local_490;
    local_298 = local_488;
    local_2b0 = local_4a0[0];
    local_2c0 = local_4a0[0];
    local_288 = local_4a0[0];
    local_290 = &local_2a0;
    bVar1 = false;
    local_2a8 = local_2b8;
    local_280 = local_2b8;
    if (local_488 == local_2b8) {
      local_a8 = local_490;
      local_b0 = local_4a0[0];
      local_b8 = local_2b8;
      if (local_2b8 == (char *)0x0) {
        local_9c = 0;
      }
      else {
        local_9c = memcmp(local_490,local_4a0[0],(size_t)local_2b8);
      }
      bVar1 = local_9c == 0;
    }
    if (bVar1) {
      llvm::make_unique<(anonymous_namespace)::ShellTool,llvm::StringRef&>
                ((llvm *)&local_4a8,(StringRef *)&this_local);
      std::unique_ptr<llbuild::buildsystem::Tool,std::default_delete<llbuild::buildsystem::Tool>>::
      unique_ptr<(anonymous_namespace)::ShellTool,std::default_delete<(anonymous_namespace)::ShellTool>,void>
                ((unique_ptr<llbuild::buildsystem::Tool,std::default_delete<llbuild::buildsystem::Tool>>
                  *)this,&local_4a8);
      std::
      unique_ptr<(anonymous_namespace)::ShellTool,_std::default_delete<(anonymous_namespace)::ShellTool>_>
      ::~unique_ptr(&local_4a8);
    }
    else {
      local_4b8 = this_local;
      local_4b0 = name_local.Data;
      local_80 = local_4c8;
      local_88 = "phony";
      local_4c8[0] = "phony";
      local_2e8 = (char *)strlen("phony");
      local_2d0 = local_4b8;
      local_2c8 = local_4b0;
      local_2e0 = local_4c8[0];
      local_2f0 = local_4c8[0];
      local_270 = local_4c8[0];
      local_278 = &local_2d0;
      bVar1 = false;
      local_2d8 = local_2e8;
      local_268 = local_2e8;
      if (local_4b0 == local_2e8) {
        local_c8 = local_4b8;
        local_d0 = local_4c8[0];
        local_d8 = local_2e8;
        if (local_2e8 == (char *)0x0) {
          local_bc = 0;
        }
        else {
          local_bc = memcmp(local_4b8,local_4c8[0],(size_t)local_2e8);
        }
        bVar1 = local_bc == 0;
      }
      if (bVar1) {
        llvm::make_unique<(anonymous_namespace)::PhonyTool,llvm::StringRef&>
                  ((llvm *)&local_4d0,(StringRef *)&this_local);
        std::unique_ptr<llbuild::buildsystem::Tool,std::default_delete<llbuild::buildsystem::Tool>>
        ::
        unique_ptr<(anonymous_namespace)::PhonyTool,std::default_delete<(anonymous_namespace)::PhonyTool>,void>
                  ((unique_ptr<llbuild::buildsystem::Tool,std::default_delete<llbuild::buildsystem::Tool>>
                    *)this,&local_4d0);
        std::
        unique_ptr<(anonymous_namespace)::PhonyTool,_std::default_delete<(anonymous_namespace)::PhonyTool>_>
        ::~unique_ptr(&local_4d0);
      }
      else {
        local_4e0 = this_local;
        local_4d8 = name_local.Data;
        local_70 = local_4f0;
        local_78 = "clang";
        local_4f0[0] = "clang";
        local_318 = (char *)strlen("clang");
        local_300 = local_4e0;
        local_2f8 = local_4d8;
        local_310 = local_4f0[0];
        local_320 = local_4f0[0];
        local_258 = local_4f0[0];
        local_260 = &local_300;
        bVar1 = false;
        local_308 = local_318;
        local_250 = local_318;
        if (local_4d8 == local_318) {
          local_e8 = local_4e0;
          local_f0 = local_4f0[0];
          local_f8 = local_318;
          if (local_318 == (char *)0x0) {
            local_dc = 0;
          }
          else {
            local_dc = memcmp(local_4e0,local_4f0[0],(size_t)local_318);
          }
          bVar1 = local_dc == 0;
        }
        if (bVar1) {
          llvm::make_unique<(anonymous_namespace)::ClangTool,llvm::StringRef&>
                    ((llvm *)&local_4f8,(StringRef *)&this_local);
          std::
          unique_ptr<llbuild::buildsystem::Tool,std::default_delete<llbuild::buildsystem::Tool>>::
          unique_ptr<(anonymous_namespace)::ClangTool,std::default_delete<(anonymous_namespace)::ClangTool>,void>
                    ((unique_ptr<llbuild::buildsystem::Tool,std::default_delete<llbuild::buildsystem::Tool>>
                      *)this,&local_4f8);
          std::
          unique_ptr<(anonymous_namespace)::ClangTool,_std::default_delete<(anonymous_namespace)::ClangTool>_>
          ::~unique_ptr(&local_4f8);
        }
        else {
          local_508 = this_local;
          local_500 = name_local.Data;
          local_60 = local_518;
          local_68 = "mkdir";
          local_518[0] = "mkdir";
          local_348 = (char *)strlen("mkdir");
          local_330 = local_508;
          local_328 = local_500;
          local_340 = local_518[0];
          local_350 = local_518[0];
          local_240 = local_518[0];
          local_248 = &local_330;
          bVar1 = false;
          local_338 = local_348;
          local_238 = local_348;
          if (local_500 == local_348) {
            local_108 = local_508;
            local_110 = local_518[0];
            local_118 = local_348;
            if (local_348 == (char *)0x0) {
              local_fc = 0;
            }
            else {
              local_fc = memcmp(local_508,local_518[0],(size_t)local_348);
            }
            bVar1 = local_fc == 0;
          }
          if (bVar1) {
            llvm::make_unique<(anonymous_namespace)::MkdirTool,llvm::StringRef&>
                      ((llvm *)&local_520,(StringRef *)&this_local);
            std::
            unique_ptr<llbuild::buildsystem::Tool,std::default_delete<llbuild::buildsystem::Tool>>::
            unique_ptr<(anonymous_namespace)::MkdirTool,std::default_delete<(anonymous_namespace)::MkdirTool>,void>
                      ((unique_ptr<llbuild::buildsystem::Tool,std::default_delete<llbuild::buildsystem::Tool>>
                        *)this,&local_520);
            std::
            unique_ptr<(anonymous_namespace)::MkdirTool,_std::default_delete<(anonymous_namespace)::MkdirTool>_>
            ::~unique_ptr(&local_520);
          }
          else {
            local_530 = this_local;
            local_528 = name_local.Data;
            local_50 = local_540;
            local_58 = "symlink";
            local_540[0] = "symlink";
            local_378 = (char *)strlen("symlink");
            local_360 = local_530;
            local_358 = local_528;
            local_370 = local_540[0];
            local_380 = local_540[0];
            local_228 = local_540[0];
            local_230 = &local_360;
            bVar1 = false;
            local_368 = local_378;
            local_220 = local_378;
            if (local_528 == local_378) {
              local_128 = local_530;
              local_130 = local_540[0];
              local_138 = local_378;
              if (local_378 == (char *)0x0) {
                local_11c = 0;
              }
              else {
                local_11c = memcmp(local_530,local_540[0],(size_t)local_378);
              }
              bVar1 = local_11c == 0;
            }
            if (bVar1) {
              llvm::make_unique<(anonymous_namespace)::SymlinkTool,llvm::StringRef&>
                        ((llvm *)&local_548,(StringRef *)&this_local);
              std::
              unique_ptr<llbuild::buildsystem::Tool,std::default_delete<llbuild::buildsystem::Tool>>
              ::
              unique_ptr<(anonymous_namespace)::SymlinkTool,std::default_delete<(anonymous_namespace)::SymlinkTool>,void>
                        ((unique_ptr<llbuild::buildsystem::Tool,std::default_delete<llbuild::buildsystem::Tool>>
                          *)this,&local_548);
              std::
              unique_ptr<(anonymous_namespace)::SymlinkTool,_std::default_delete<(anonymous_namespace)::SymlinkTool>_>
              ::~unique_ptr(&local_548);
            }
            else {
              local_558 = this_local;
              local_550 = name_local.Data;
              local_40 = local_568;
              local_48 = "archive";
              local_568[0] = "archive";
              local_3a8 = (char *)strlen("archive");
              local_390 = local_558;
              local_388 = local_550;
              local_3a0 = local_568[0];
              local_3b0 = local_568[0];
              local_210 = local_568[0];
              local_218 = &local_390;
              bVar1 = false;
              local_398 = local_3a8;
              local_208 = local_3a8;
              if (local_550 == local_3a8) {
                local_148 = local_558;
                local_150 = local_568[0];
                local_158 = local_3a8;
                if (local_3a8 == (char *)0x0) {
                  local_13c = 0;
                }
                else {
                  local_13c = memcmp(local_558,local_568[0],(size_t)local_3a8);
                }
                bVar1 = local_13c == 0;
              }
              if (bVar1) {
                llvm::make_unique<(anonymous_namespace)::ArchiveTool,llvm::StringRef&>
                          ((llvm *)&local_570,(StringRef *)&this_local);
                std::
                unique_ptr<llbuild::buildsystem::Tool,std::default_delete<llbuild::buildsystem::Tool>>
                ::
                unique_ptr<(anonymous_namespace)::ArchiveTool,std::default_delete<(anonymous_namespace)::ArchiveTool>,void>
                          ((unique_ptr<llbuild::buildsystem::Tool,std::default_delete<llbuild::buildsystem::Tool>>
                            *)this,&local_570);
                std::
                unique_ptr<(anonymous_namespace)::ArchiveTool,_std::default_delete<(anonymous_namespace)::ArchiveTool>_>
                ::~unique_ptr(&local_570);
              }
              else {
                local_580 = this_local;
                local_578 = name_local.Data;
                local_30 = local_590;
                local_38 = "shared-library";
                local_590[0] = "shared-library";
                local_3d8 = (char *)strlen("shared-library");
                local_3c0 = local_580;
                local_3b8 = local_578;
                local_3d0 = local_590[0];
                local_3e0 = local_590[0];
                local_1f8 = local_590[0];
                local_200 = &local_3c0;
                bVar1 = false;
                local_3c8 = local_3d8;
                local_1f0 = local_3d8;
                if (local_578 == local_3d8) {
                  local_168 = local_580;
                  local_170 = local_590[0];
                  local_178 = local_3d8;
                  if (local_3d8 == (char *)0x0) {
                    local_15c = 0;
                  }
                  else {
                    local_15c = memcmp(local_580,local_590[0],(size_t)local_3d8);
                  }
                  bVar1 = local_15c == 0;
                }
                if (bVar1) {
                  llvm::make_unique<(anonymous_namespace)::SharedLibraryTool,llvm::StringRef&>
                            ((llvm *)&local_598,(StringRef *)&this_local);
                  std::
                  unique_ptr<llbuild::buildsystem::Tool,std::default_delete<llbuild::buildsystem::Tool>>
                  ::
                  unique_ptr<(anonymous_namespace)::SharedLibraryTool,std::default_delete<(anonymous_namespace)::SharedLibraryTool>,void>
                            ((unique_ptr<llbuild::buildsystem::Tool,std::default_delete<llbuild::buildsystem::Tool>>
                              *)this,&local_598);
                  std::
                  unique_ptr<(anonymous_namespace)::SharedLibraryTool,_std::default_delete<(anonymous_namespace)::SharedLibraryTool>_>
                  ::~unique_ptr(&local_598);
                }
                else {
                  local_5a8 = this_local;
                  local_5a0 = name_local.Data;
                  local_20 = local_5b8;
                  local_28 = "stale-file-removal";
                  local_5b8[0] = "stale-file-removal";
                  local_408 = (char *)strlen("stale-file-removal");
                  local_3f0 = local_5a8;
                  local_3e8 = local_5a0;
                  local_400 = local_5b8[0];
                  local_410 = local_5b8[0];
                  local_1e0 = local_5b8[0];
                  local_1e8 = &local_3f0;
                  bVar1 = false;
                  local_3f8 = local_408;
                  local_1d8 = local_408;
                  if (local_5a0 == local_408) {
                    local_188 = local_5a8;
                    local_190 = local_5b8[0];
                    local_198 = local_408;
                    if (local_408 == (char *)0x0) {
                      local_17c = 0;
                    }
                    else {
                      local_17c = memcmp(local_5a8,local_5b8[0],(size_t)local_408);
                    }
                    bVar1 = local_17c == 0;
                  }
                  if (bVar1) {
                    llvm::make_unique<(anonymous_namespace)::StaleFileRemovalTool,llvm::StringRef&>
                              ((llvm *)&local_5c0,(StringRef *)&this_local);
                    std::
                    unique_ptr<llbuild::buildsystem::Tool,std::default_delete<llbuild::buildsystem::Tool>>
                    ::
                    unique_ptr<(anonymous_namespace)::StaleFileRemovalTool,std::default_delete<(anonymous_namespace)::StaleFileRemovalTool>,void>
                              ((unique_ptr<llbuild::buildsystem::Tool,std::default_delete<llbuild::buildsystem::Tool>>
                                *)this,&local_5c0);
                    std::
                    unique_ptr<(anonymous_namespace)::StaleFileRemovalTool,_std::default_delete<(anonymous_namespace)::StaleFileRemovalTool>_>
                    ::~unique_ptr(&local_5c0);
                  }
                  else {
                    local_5d0 = this_local;
                    local_5c8 = name_local.Data;
                    local_10 = local_5e0;
                    local_18 = "swift-compiler";
                    local_5e0[0] = "swift-compiler";
                    local_1c0 = (char *)strlen("swift-compiler");
                    local_420 = local_5d0;
                    local_418 = local_5c8;
                    local_1c8 = local_5e0[0];
                    local_1d0 = &local_420;
                    bVar1 = false;
                    if (local_5c8 == local_1c0) {
                      local_1a8 = local_5d0;
                      local_1b0 = local_5e0[0];
                      local_1b8 = local_1c0;
                      if (local_1c0 == (char *)0x0) {
                        local_19c = 0;
                      }
                      else {
                        local_19c = memcmp(local_5d0,local_5e0[0],(size_t)local_1c0);
                      }
                      bVar1 = local_19c == 0;
                    }
                    if (bVar1) {
                      llvm::make_unique<(anonymous_namespace)::SwiftCompilerTool,llvm::StringRef&>
                                ((llvm *)&local_5e8,(StringRef *)&this_local);
                      std::
                      unique_ptr<llbuild::buildsystem::Tool,std::default_delete<llbuild::buildsystem::Tool>>
                      ::
                      unique_ptr<(anonymous_namespace)::SwiftCompilerTool,std::default_delete<(anonymous_namespace)::SwiftCompilerTool>,void>
                                ((unique_ptr<llbuild::buildsystem::Tool,std::default_delete<llbuild::buildsystem::Tool>>
                                  *)this,&local_5e8);
                      std::
                      unique_ptr<(anonymous_namespace)::SwiftCompilerTool,_std::default_delete<(anonymous_namespace)::SwiftCompilerTool>_>
                      ::~unique_ptr(&local_5e8);
                    }
                    else {
                      std::
                      unique_ptr<llbuild::buildsystem::Tool,std::default_delete<llbuild::buildsystem::Tool>>
                      ::unique_ptr<std::default_delete<llbuild::buildsystem::Tool>,void>
                                ((unique_ptr<llbuild::buildsystem::Tool,std::default_delete<llbuild::buildsystem::Tool>>
                                  *)this,(nullptr_t)0x0);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return (__uniq_ptr_data<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>,_true,_true>
          )(__uniq_ptr_data<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Tool>
BuildSystemFileDelegate::lookupTool(StringRef name) {
  // First, give the client an opportunity to create the tool.
  if (auto tool = getSystemDelegate().lookupTool(name)) {
    return tool;
  }

  // Otherwise, look for one of the builtin tool definitions.
  if (name == "shell") {
    return llvm::make_unique<ShellTool>(name);
  } else if (name == "phony") {
    return llvm::make_unique<PhonyTool>(name);
  } else if (name == "clang") {
    return llvm::make_unique<ClangTool>(name);
  } else if (name == "mkdir") {
    return llvm::make_unique<MkdirTool>(name);
  } else if (name == "symlink") {
    return llvm::make_unique<SymlinkTool>(name);
  } else if (name == "archive") {
    return llvm::make_unique<ArchiveTool>(name);
  } else if (name == "shared-library") {
    return llvm::make_unique<SharedLibraryTool>(name);
  } else if (name == "stale-file-removal") {
    return llvm::make_unique<StaleFileRemovalTool>(name);
  } else if (name == "swift-compiler") {
    return llvm::make_unique<SwiftCompilerTool>(name);
  }

  return nullptr;
}